

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O1

ParameterError parse_continue_at(GlobalConfig *global,OperationConfig *config,char *nextarg)

{
  int iVar1;
  ParameterError PVar2;
  char *fmt;
  
  if (config->range == (char *)0x0) {
    if ((config->field_0x4de & 0x20) == 0) {
      if (config->file_clobber_mode != CLOBBER_NEVER) {
        iVar1 = strcmp(nextarg,"-");
        if (iVar1 == 0) {
          config->field_0x4d4 = config->field_0x4d4 | 0x20;
          config->resume_from = 0;
          PVar2 = PARAM_OK;
        }
        else {
          PVar2 = str2offset(&config->resume_from,nextarg);
          config->field_0x4d4 = config->field_0x4d4 & 0xdf;
        }
        config->field_0x4d4 = config->field_0x4d4 | 0x10;
        return PVar2;
      }
      global = config->global;
      fmt = "--continue-at is mutually exclusive with --no-clobber";
    }
    else {
      global = config->global;
      fmt = "--continue-at is mutually exclusive with --remove-on-error";
    }
  }
  else {
    fmt = "--continue-at is mutually exclusive with --range";
  }
  errorf(global,fmt);
  return PARAM_BAD_USE;
}

Assistant:

static ParameterError parse_continue_at(struct GlobalConfig *global,
                                        struct OperationConfig *config,
                                        const char *nextarg)
{
  ParameterError err = PARAM_OK;
  if(config->range) {
    errorf(global, "--continue-at is mutually exclusive with --range");
    return PARAM_BAD_USE;
  }
  if(config->rm_partial) {
    errorf(config->global,
           "--continue-at is mutually exclusive with --remove-on-error");
    return PARAM_BAD_USE;
  }
  if(config->file_clobber_mode == CLOBBER_NEVER) {
    errorf(config->global,
           "--continue-at is mutually exclusive with --no-clobber");
    return PARAM_BAD_USE;
  }
  /* This makes us continue an ftp transfer at given position */
  if(strcmp(nextarg, "-")) {
    err = str2offset(&config->resume_from, nextarg);
    config->resume_from_current = FALSE;
  }
  else {
    config->resume_from_current = TRUE;
    config->resume_from = 0;
  }
  config->use_resume = TRUE;
  return err;
}